

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  uint uVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  float old_t;
  undefined1 local_14c8 [16];
  Geometry *local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  ulong local_1498;
  NodeRef *local_1490;
  Scene *scene;
  long local_1480;
  RTCFilterFunctionNArguments args;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  byte local_1337;
  float local_1328 [4];
  undefined1 local_1318 [16];
  float local_1308 [4];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  RTCHitN local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  uint local_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  uint uStack_1240;
  uint uStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1490 = stack + 1;
  stack[0] = root;
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar76 = ZEXT3264(auVar60);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar77 = ZEXT3264(auVar61);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar78 = ZEXT3264(auVar62);
  auVar41 = vmulss_avx512f(auVar60._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar42 = vmulss_avx512f(auVar61._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar29 = auVar41._0_4_;
  uVar66 = auVar42._0_4_;
  auVar41 = vmulss_avx512f(auVar62._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar67 = auVar41._0_4_;
  local_1498 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = local_1498 ^ 0x20;
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar80 = ZEXT3264(auVar60);
  local_11f8._0_8_ = CONCAT44(uVar29,uVar29) ^ 0x8000000080000000;
  local_11f8._8_4_ = uVar29 ^ 0x80000000;
  local_11f8._12_4_ = uVar29 ^ 0x80000000;
  local_11f8._16_4_ = uVar29 ^ 0x80000000;
  local_11f8._20_4_ = uVar29 ^ 0x80000000;
  local_11f8._24_4_ = uVar29 ^ 0x80000000;
  local_11f8._28_4_ = uVar29 ^ 0x80000000;
  auVar72 = ZEXT3264(local_11f8);
  local_1218._0_8_ = CONCAT44(uVar66,uVar66) ^ 0x8000000080000000;
  local_1218._8_4_ = uVar66 ^ 0x80000000;
  local_1218._12_4_ = uVar66 ^ 0x80000000;
  local_1218._16_4_ = uVar66 ^ 0x80000000;
  local_1218._20_4_ = uVar66 ^ 0x80000000;
  local_1218._24_4_ = uVar66 ^ 0x80000000;
  local_1218._28_4_ = uVar66 ^ 0x80000000;
  auVar73 = ZEXT3264(local_1218);
  local_1238._0_8_ = CONCAT44(uVar67,uVar67) ^ 0x8000000080000000;
  local_1238._8_4_ = uVar67 ^ 0x80000000;
  local_1238._12_4_ = uVar67 ^ 0x80000000;
  local_1238._16_4_ = uVar67 ^ 0x80000000;
  local_1238._20_4_ = uVar67 ^ 0x80000000;
  local_1238._24_4_ = uVar67 ^ 0x80000000;
  local_1238._28_4_ = uVar67 ^ 0x80000000;
  auVar74 = ZEXT3264(local_1238);
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar40 = true;
  uVar36 = local_1498;
LAB_0078e8f0:
  do {
    sVar35 = local_1490[-1].ptr;
    local_1490 = local_1490 + -1;
    while ((sVar35 & 8) == 0) {
      uVar19 = sVar35 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar65._4_4_ = uVar2;
      auVar65._0_4_ = uVar2;
      auVar65._8_4_ = uVar2;
      auVar65._12_4_ = uVar2;
      auVar65._16_4_ = uVar2;
      auVar65._20_4_ = uVar2;
      auVar65._24_4_ = uVar2;
      auVar65._28_4_ = uVar2;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar36),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + uVar36));
      auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar76._0_32_,auVar72._0_32_);
      auVar61 = vmaxps_avx512vl(auVar79._0_32_,auVar60);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar26),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + uVar26));
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar37),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + uVar37));
      auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar77._0_32_,auVar73._0_32_);
      auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar78._0_32_,auVar74._0_32_);
      auVar60 = vmaxps_avx(auVar60,auVar62);
      auVar60 = vmaxps_avx(auVar61,auVar60);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar38),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + uVar38));
      auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar76._0_32_,auVar72._0_32_);
      auVar62 = vminps_avx512vl(auVar80._0_32_,auVar61);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar26 ^ 0x20)),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar26 ^ 0x20)));
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar37 ^ 0x20)),auVar65,
                                *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar37 ^ 0x20)));
      auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar77._0_32_,auVar73._0_32_);
      auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar78._0_32_,auVar74._0_32_);
      auVar61 = vminps_avx(auVar61,auVar63);
      auVar61 = vminps_avx(auVar62,auVar61);
      if (((uint)sVar35 & 7) == 6) {
        uVar16 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar17 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar19 + 0x1c0),0xd);
        uVar18 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
        uVar29 = (uint)uVar16 & (uint)uVar17 & (uint)uVar18;
      }
      else {
        uVar16 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar29 = (uint)uVar16;
      }
      if ((byte)uVar29 == 0) {
        bVar40 = local_1490 != stack;
        if (!bVar40) {
          return bVar40;
        }
        goto LAB_0078e8f0;
      }
      lVar25 = 0;
      for (uVar27 = (ulong)(byte)uVar29; (uVar27 & 1) == 0;
          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      sVar35 = *(size_t *)(uVar19 + lVar25 * 8);
      uVar29 = (uVar29 & 0xff) - 1 & uVar29 & 0xff;
      uVar27 = (ulong)uVar29;
      if (uVar29 != 0) {
        local_1490->ptr = sVar35;
        lVar25 = 0;
        for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar27 = (ulong)uVar29;
        bVar39 = uVar29 == 0;
        while( true ) {
          local_1490 = local_1490 + 1;
          sVar35 = *(size_t *)(uVar19 + lVar25 * 8);
          if (bVar39) break;
          local_1490->ptr = sVar35;
          lVar25 = 0;
          for (uVar20 = uVar27; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          bVar39 = uVar27 == 0;
        }
      }
    }
    local_1480 = (ulong)((uint)sVar35 & 0xf) - 8;
    if (local_1480 != 0) {
      uVar36 = sVar35 & 0xfffffffffffffff0;
      lVar25 = 0;
      do {
        lVar33 = lVar25 * 0x50;
        scene = context->scene;
        pGVar9 = (scene->geometries).items[*(uint *)(uVar36 + 0x30 + lVar33)].ptr;
        fVar3 = (pGVar9->time_range).lower;
        fVar3 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar3) / ((pGVar9->time_range).upper - fVar3));
        auVar42 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
        auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
        auVar12 = vmaxss_avx(ZEXT816(0) << 0x20,auVar42);
        lVar24 = (long)(int)auVar12._0_4_ * 0x38;
        lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar24);
        auVar42 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar36 + lVar33) * 4);
        uVar19 = (ulong)*(uint *)(uVar36 + 0x10 + lVar33);
        auVar59 = *(undefined1 (*) [16])(lVar10 + uVar19 * 4);
        uVar27 = (ulong)*(uint *)(uVar36 + 0x20 + lVar33);
        auVar75 = *(undefined1 (*) [16])(lVar10 + uVar27 * 4);
        uVar20 = (ulong)*(uint *)(uVar36 + 4 + lVar33);
        auVar43 = *(undefined1 (*) [16])(lVar10 + uVar20 * 4);
        uVar21 = (ulong)*(uint *)(uVar36 + 0x14 + lVar33);
        auVar54 = *(undefined1 (*) [16])(lVar10 + uVar21 * 4);
        uVar22 = (ulong)*(uint *)(uVar36 + 0x24 + lVar33);
        auVar56 = *(undefined1 (*) [16])(lVar10 + uVar22 * 4);
        uVar23 = (ulong)*(uint *)(uVar36 + 8 + lVar33);
        auVar44 = *(undefined1 (*) [16])(lVar10 + uVar23 * 4);
        uVar34 = (ulong)*(uint *)(uVar36 + 0x18 + lVar33);
        auVar46 = *(undefined1 (*) [16])(lVar10 + uVar34 * 4);
        uVar32 = (ulong)*(uint *)(uVar36 + 0x28 + lVar33);
        auVar57 = *(undefined1 (*) [16])(lVar10 + uVar32 * 4);
        uVar31 = (ulong)*(uint *)(uVar36 + 0xc + lVar33);
        auVar58 = *(undefined1 (*) [16])(lVar10 + uVar31 * 4);
        uVar30 = (ulong)*(uint *)(uVar36 + 0x1c + lVar33);
        auVar55 = *(undefined1 (*) [16])(lVar10 + uVar30 * 4);
        lVar24 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar24);
        uVar28 = (ulong)*(uint *)(uVar36 + 0x2c + lVar33);
        auVar45 = *(undefined1 (*) [16])(lVar10 + uVar28 * 4);
        auVar47 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar36 + lVar33) * 4);
        auVar48 = *(undefined1 (*) [16])(lVar24 + uVar19 * 4);
        auVar51 = *(undefined1 (*) [16])(lVar24 + uVar27 * 4);
        auVar49 = *(undefined1 (*) [16])(lVar24 + uVar20 * 4);
        auVar50 = *(undefined1 (*) [16])(lVar24 + uVar21 * 4);
        auVar52 = *(undefined1 (*) [16])(lVar24 + uVar22 * 4);
        auVar53 = *(undefined1 (*) [16])(lVar24 + uVar23 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
        auVar5 = *(undefined1 (*) [16])(lVar24 + uVar32 * 4);
        auVar6 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
        auVar7 = *(undefined1 (*) [16])(lVar24 + uVar30 * 4);
        auVar8 = *(undefined1 (*) [16])(lVar24 + uVar28 * 4);
        puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar33);
        local_1388 = *puVar1;
        uStack_1380 = puVar1[1];
        puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar33);
        auVar13 = vunpcklps_avx(auVar42,auVar44);
        auVar42 = vunpckhps_avx(auVar42,auVar44);
        auVar44 = vunpcklps_avx(auVar43,auVar58);
        auVar43 = vunpckhps_avx(auVar43,auVar58);
        auVar58 = vunpcklps_avx(auVar42,auVar43);
        auVar14 = vunpcklps_avx(auVar13,auVar44);
        auVar42 = vunpckhps_avx(auVar13,auVar44);
        auVar44 = vunpcklps_avx(auVar59,auVar46);
        auVar59 = vunpckhps_avx(auVar59,auVar46);
        auVar46 = vunpcklps_avx(auVar54,auVar55);
        auVar43 = vunpckhps_avx(auVar54,auVar55);
        auVar54 = vunpcklps_avx(auVar59,auVar43);
        auVar55 = vunpcklps_avx(auVar44,auVar46);
        auVar59 = vunpckhps_avx(auVar44,auVar46);
        auVar44 = vunpcklps_avx(auVar75,auVar57);
        auVar75 = vunpckhps_avx(auVar75,auVar57);
        auVar46 = vunpcklps_avx(auVar56,auVar45);
        auVar43 = vunpckhps_avx(auVar56,auVar45);
        auVar56 = vunpcklps_avx(auVar75,auVar43);
        auVar57 = vunpcklps_avx(auVar44,auVar46);
        auVar75 = vunpckhps_avx(auVar44,auVar46);
        auVar43 = vunpcklps_avx512vl(auVar47,auVar53);
        auVar44 = vunpckhps_avx512vl(auVar47,auVar53);
        auVar45 = vunpcklps_avx512vl(auVar49,auVar6);
        auVar46 = vunpckhps_avx512vl(auVar49,auVar6);
        auVar44 = vunpcklps_avx(auVar44,auVar46);
        auVar46 = vunpcklps_avx(auVar43,auVar45);
        auVar43 = vunpckhps_avx(auVar43,auVar45);
        auVar45 = vunpcklps_avx512vl(auVar48,auVar64);
        auVar47 = vunpckhps_avx512vl(auVar48,auVar64);
        auVar48 = vunpcklps_avx512vl(auVar50,auVar7);
        auVar49 = vunpckhps_avx512vl(auVar50,auVar7);
        auVar47 = vunpcklps_avx512vl(auVar47,auVar49);
        auVar49 = vunpcklps_avx512vl(auVar45,auVar48);
        auVar48 = vunpckhps_avx512vl(auVar45,auVar48);
        auVar50 = vunpcklps_avx512vl(auVar51,auVar5);
        auVar45 = vunpckhps_avx512vl(auVar51,auVar5);
        auVar51 = vunpcklps_avx512vl(auVar52,auVar8);
        auVar52 = vunpckhps_avx512vl(auVar52,auVar8);
        auVar45 = vunpcklps_avx(auVar45,auVar52);
        auVar52 = vunpcklps_avx512vl(auVar50,auVar51);
        auVar51 = vunpckhps_avx512vl(auVar50,auVar51);
        auVar53 = ZEXT416((uint)(fVar3 - auVar12._0_4_));
        auVar50 = vbroadcastss_avx512vl(auVar53);
        auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
        auVar64._0_4_ = auVar53._0_4_;
        auVar64._4_4_ = auVar64._0_4_;
        auVar64._8_4_ = auVar64._0_4_;
        auVar64._12_4_ = auVar64._0_4_;
        auVar46 = vmulps_avx512vl(auVar50,auVar46);
        auVar43 = vmulps_avx512vl(auVar50,auVar43);
        auVar53 = vmulps_avx512vl(auVar50,auVar44);
        auVar44 = vfmadd231ps_fma(auVar46,auVar64,auVar14);
        auVar46 = vfmadd231ps_fma(auVar43,auVar64,auVar42);
        auVar58 = vfmadd231ps_fma(auVar53,auVar64,auVar58);
        auVar42 = vmulps_avx512vl(auVar50,auVar49);
        auVar43 = vmulps_avx512vl(auVar50,auVar48);
        auVar47 = vmulps_avx512vl(auVar50,auVar47);
        auVar42 = vfmadd231ps_fma(auVar42,auVar64,auVar55);
        auVar59 = vfmadd231ps_fma(auVar43,auVar64,auVar59);
        auVar43 = vfmadd231ps_fma(auVar47,auVar64,auVar54);
        auVar54 = vmulps_avx512vl(auVar50,auVar52);
        auVar55 = vmulps_avx512vl(auVar50,auVar51);
        auVar45 = vmulps_avx512vl(auVar50,auVar45);
        auVar54 = vfmadd231ps_fma(auVar54,auVar64,auVar57);
        auVar57 = vfmadd231ps_fma(auVar55,auVar64,auVar75);
        auVar56 = vfmadd231ps_fma(auVar45,auVar64,auVar56);
        local_1398 = *puVar1;
        uStack_1390 = puVar1[1];
        auVar42 = vsubps_avx(auVar44,auVar42);
        auVar59 = vsubps_avx(auVar46,auVar59);
        auVar75 = vsubps_avx(auVar58,auVar43);
        auVar43 = vsubps_avx(auVar54,auVar44);
        auVar54 = vsubps_avx(auVar57,auVar46);
        auVar55 = vsubps_avx512vl(auVar56,auVar58);
        auVar56 = vmulps_avx512vl(auVar59,auVar55);
        local_12f8 = vfmsub231ps_fma(auVar56,auVar54,auVar75);
        auVar45._0_4_ = auVar75._0_4_ * auVar43._0_4_;
        auVar45._4_4_ = auVar75._4_4_ * auVar43._4_4_;
        auVar45._8_4_ = auVar75._8_4_ * auVar43._8_4_;
        auVar45._12_4_ = auVar75._12_4_ * auVar43._12_4_;
        local_12e8 = vfmsub231ps_avx512vl(auVar45,auVar55,auVar42);
        auVar47._0_4_ = auVar42._0_4_ * auVar54._0_4_;
        auVar47._4_4_ = auVar42._4_4_ * auVar54._4_4_;
        auVar47._8_4_ = auVar42._8_4_ * auVar54._8_4_;
        auVar47._12_4_ = auVar42._12_4_ * auVar54._12_4_;
        fVar3 = *(float *)(ray + k * 4 + 0x40);
        auVar51._4_4_ = fVar3;
        auVar51._0_4_ = fVar3;
        auVar51._8_4_ = fVar3;
        auVar51._12_4_ = fVar3;
        fVar68 = *(float *)(ray + k * 4 + 0x50);
        auVar49._4_4_ = fVar68;
        auVar49._0_4_ = fVar68;
        auVar49._8_4_ = fVar68;
        auVar49._12_4_ = fVar68;
        auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar56._4_4_ = uVar2;
        auVar56._0_4_ = uVar2;
        auVar56._8_4_ = uVar2;
        auVar56._12_4_ = uVar2;
        auVar45 = vsubps_avx512vl(auVar44,auVar56);
        local_12d8 = vfmsub231ps_fma(auVar47,auVar43,auVar59);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar44._4_4_ = uVar2;
        auVar44._0_4_ = uVar2;
        auVar44._8_4_ = uVar2;
        auVar44._12_4_ = uVar2;
        auVar47 = vsubps_avx512vl(auVar46,auVar44);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar46._4_4_ = uVar2;
        auVar46._0_4_ = uVar2;
        auVar46._8_4_ = uVar2;
        auVar46._12_4_ = uVar2;
        auVar46 = vsubps_avx512vl(auVar58,auVar46);
        auVar48._0_4_ = fVar68 * auVar46._0_4_;
        auVar48._4_4_ = fVar68 * auVar46._4_4_;
        auVar48._8_4_ = fVar68 * auVar46._8_4_;
        auVar48._12_4_ = fVar68 * auVar46._12_4_;
        auVar48 = vfmsub231ps_avx512vl(auVar48,auVar47,auVar57);
        auVar56 = vmulps_avx512vl(auVar57,auVar45);
        auVar56 = vfmsub231ps_fma(auVar56,auVar46,auVar51);
        auVar50._0_4_ = fVar3 * auVar47._0_4_;
        auVar50._4_4_ = fVar3 * auVar47._4_4_;
        auVar50._8_4_ = fVar3 * auVar47._8_4_;
        auVar50._12_4_ = fVar3 * auVar47._12_4_;
        auVar44 = vfmsub231ps_fma(auVar50,auVar45,auVar49);
        auVar57 = vmulps_avx512vl(local_12d8,auVar57);
        auVar57 = vfmadd231ps_avx512vl(auVar57,local_12e8,auVar49);
        auVar51 = vfmadd231ps_avx512vl(auVar57,local_12f8,auVar51);
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        local_1348 = vandps_avx512vl(auVar51,auVar57);
        auVar58._8_4_ = 0x80000000;
        auVar58._0_8_ = 0x8000000080000000;
        auVar58._12_4_ = 0x80000000;
        auVar57 = vandps_avx512vl(auVar51,auVar58);
        auVar58 = vmulps_avx512vl(auVar55,auVar44);
        auVar54 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar54);
        auVar43 = vfmadd231ps_avx512vl(auVar54,auVar48,auVar43);
        local_1378 = vxorps_avx512vl(auVar57,auVar43);
        auVar43._0_4_ = auVar75._0_4_ * auVar44._0_4_;
        auVar43._4_4_ = auVar75._4_4_ * auVar44._4_4_;
        auVar43._8_4_ = auVar75._8_4_ * auVar44._8_4_;
        auVar43._12_4_ = auVar75._12_4_ * auVar44._12_4_;
        auVar59 = vfmadd231ps_fma(auVar43,auVar59,auVar56);
        auVar42 = vfmadd231ps_fma(auVar59,auVar42,auVar48);
        local_1368._0_4_ = (float)(auVar57._0_4_ ^ auVar42._0_4_);
        local_1368._4_4_ = (float)(auVar57._4_4_ ^ auVar42._4_4_);
        local_1368._8_4_ = (float)(auVar57._8_4_ ^ auVar42._8_4_);
        local_1368._12_4_ = (float)(auVar57._12_4_ ^ auVar42._12_4_);
        auVar42 = ZEXT816(0) << 0x20;
        uVar16 = vcmpps_avx512vl(local_1378,auVar42,5);
        uVar17 = vcmpps_avx512vl(local_1368,auVar42,5);
        uVar18 = vcmpps_avx512vl(auVar51,auVar42,4);
        auVar42._0_4_ = local_1378._0_4_ + local_1368._0_4_;
        auVar42._4_4_ = local_1378._4_4_ + local_1368._4_4_;
        auVar42._8_4_ = local_1378._8_4_ + local_1368._8_4_;
        auVar42._12_4_ = local_1378._12_4_ + local_1368._12_4_;
        uVar15 = vcmpps_avx512vl(auVar42,local_1348,2);
        local_1337 = (byte)uVar16 & (byte)uVar17 & (byte)uVar18 & (byte)uVar15;
        if (local_1337 != 0) {
          auVar75._0_4_ = auVar46._0_4_ * local_12d8._0_4_;
          auVar75._4_4_ = auVar46._4_4_ * local_12d8._4_4_;
          auVar75._8_4_ = auVar46._8_4_ * local_12d8._8_4_;
          auVar75._12_4_ = auVar46._12_4_ * local_12d8._12_4_;
          auVar42 = vfmadd213ps_fma(auVar47,local_12e8,auVar75);
          auVar42 = vfmadd213ps_fma(auVar45,local_12f8,auVar42);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          auVar59 = vmulps_avx512vl(local_1348,auVar59);
          fVar3 = *(float *)(ray + k * 4 + 0x80);
          local_1358._0_4_ = (float)(auVar57._0_4_ ^ auVar42._0_4_);
          local_1358._4_4_ = (float)(auVar57._4_4_ ^ auVar42._4_4_);
          local_1358._8_4_ = (float)(auVar57._8_4_ ^ auVar42._8_4_);
          local_1358._12_4_ = (float)(auVar57._12_4_ ^ auVar42._12_4_);
          auVar54._0_4_ = fVar3 * local_1348._0_4_;
          auVar54._4_4_ = fVar3 * local_1348._4_4_;
          auVar54._8_4_ = fVar3 * local_1348._8_4_;
          auVar54._12_4_ = fVar3 * local_1348._12_4_;
          uVar16 = vcmpps_avx512vl(local_1358,auVar54,2);
          uVar17 = vcmpps_avx512vl(auVar59,local_1358,1);
          local_1337 = (byte)uVar16 & (byte)uVar17 & local_1337;
          if (local_1337 != 0) {
            auVar42 = vrcp14ps_avx512vl(local_1348);
            auVar55._8_4_ = 0x3f800000;
            auVar55._0_8_ = 0x3f8000003f800000;
            auVar55._12_4_ = 0x3f800000;
            auVar59 = vfnmadd213ps_avx512vl(local_1348,auVar42,auVar55);
            auVar42 = vfmadd132ps_fma(auVar59,auVar42,auVar42);
            fVar68 = auVar42._0_4_;
            fVar69 = auVar42._4_4_;
            fVar70 = auVar42._8_4_;
            fVar71 = auVar42._12_4_;
            local_1308[0] = fVar68 * local_1358._0_4_;
            local_1308[1] = fVar69 * local_1358._4_4_;
            local_1308[2] = fVar70 * local_1358._8_4_;
            local_1308[3] = fVar71 * local_1358._12_4_;
            local_1328[0] = fVar68 * local_1378._0_4_;
            local_1328[1] = fVar69 * local_1378._4_4_;
            local_1328[2] = fVar70 * local_1378._8_4_;
            local_1328[3] = fVar71 * local_1378._12_4_;
            local_1318._0_4_ = fVar68 * local_1368._0_4_;
            local_1318._4_4_ = fVar69 * local_1368._4_4_;
            local_1318._8_4_ = fVar70 * local_1368._8_4_;
            local_1318._12_4_ = fVar71 * local_1368._12_4_;
            local_14a0 = (ulong)local_1337;
            do {
              local_14a8 = 0;
              for (uVar19 = local_14a0; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000
                  ) {
                local_14a8 = local_14a8 + 1;
              }
              local_14b0 = (scene->geometries).items[*(uint *)((long)&local_1388 + local_14a8 * 4)].
                           ptr;
              if ((local_14b0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_14a0 = local_14a0 ^ 1L << (local_14a8 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_14b0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0078f2c2:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar40;
                }
                uVar19 = (ulong)(uint)((int)local_14a8 * 4);
                uVar2 = *(undefined4 *)((long)local_1328 + uVar19);
                local_1298._4_4_ = uVar2;
                local_1298._0_4_ = uVar2;
                local_1298._8_4_ = uVar2;
                local_1298._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1318 + uVar19);
                local_1288._4_4_ = uVar2;
                local_1288._0_4_ = uVar2;
                local_1288._8_4_ = uVar2;
                local_1288._12_4_ = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_1308 + uVar19);
                args.context = context->user;
                local_1268 = vpbroadcastd_avx512vl();
                uVar2 = *(undefined4 *)((long)&local_1398 + uVar19);
                local_1278._4_4_ = uVar2;
                local_1278._0_4_ = uVar2;
                local_1278._8_4_ = uVar2;
                local_1278._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_12f8 + uVar19);
                uVar4 = *(undefined4 *)(local_12e8 + uVar19);
                local_12b8._4_4_ = uVar4;
                local_12b8._0_4_ = uVar4;
                local_12b8._8_4_ = uVar4;
                local_12b8._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_12d8 + uVar19);
                local_12a8._4_4_ = uVar4;
                local_12a8._0_4_ = uVar4;
                local_12a8._8_4_ = uVar4;
                local_12a8._12_4_ = uVar4;
                local_12c8[0] = (RTCHitN)(char)uVar2;
                local_12c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_12c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_12c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_12c8[4] = (RTCHitN)(char)uVar2;
                local_12c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_12c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_12c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_12c8[8] = (RTCHitN)(char)uVar2;
                local_12c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_12c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_12c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_12c8[0xc] = (RTCHitN)(char)uVar2;
                local_12c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_12c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_12c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_1268),ZEXT1632(local_1268));
                uStack_1254 = (args.context)->instID[0];
                local_1258 = uStack_1254;
                uStack_1250 = uStack_1254;
                uStack_124c = uStack_1254;
                uStack_1248 = (args.context)->instPrimID[0];
                uStack_1244 = uStack_1248;
                uStack_1240 = uStack_1248;
                uStack_123c = uStack_1248;
                args.valid = (int *)local_14c8;
                args.geometryUserPtr = local_14b0->userPtr;
                args.hit = local_12c8;
                args.N = 4;
                local_14c8 = auVar41;
                args.ray = (RTCRayN *)ray;
                if (local_14b0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_14b0->occlusionFilterN)(&args);
                }
                uVar19 = vptestmd_avx512vl(local_14c8,local_14c8);
                if ((uVar19 & 0xf) != 0) {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_14b0->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var11)(&args);
                  }
                  uVar19 = vptestmd_avx512vl(local_14c8,local_14c8);
                  uVar19 = uVar19 & 0xf;
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar39 = (bool)((byte)uVar19 & 1);
                  auVar52._0_4_ =
                       (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x80);
                  bVar39 = (bool)((byte)(uVar19 >> 1) & 1);
                  auVar52._4_4_ =
                       (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x84);
                  bVar39 = (bool)((byte)(uVar19 >> 2) & 1);
                  auVar52._8_4_ =
                       (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x88);
                  bVar39 = SUB81(uVar19 >> 3,0);
                  auVar52._12_4_ =
                       (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar52;
                  if ((byte)uVar19 != 0) goto LAB_0078f2c2;
                }
                *(float *)(ray + k * 4 + 0x80) = fVar3;
                local_14a0 = local_14a0 ^ 1L << (local_14a8 & 0x3f);
                auVar76 = ZEXT3264(auVar76._0_32_);
                auVar77 = ZEXT3264(auVar77._0_32_);
                auVar78 = ZEXT3264(auVar78._0_32_);
                auVar79 = ZEXT3264(auVar79._0_32_);
                auVar80 = ZEXT3264(auVar80._0_32_);
              }
            } while (local_14a0 != 0);
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != local_1480);
    }
    bVar40 = local_1490 != stack;
    auVar72 = ZEXT3264(local_11f8);
    auVar73 = ZEXT3264(local_1218);
    auVar74 = ZEXT3264(local_1238);
    uVar36 = local_1498;
    if (!bVar40) {
      return bVar40;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }